

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O3

void __thiscall
slang::driver::SourceLoader::addFilesInternal
          (SourceLoader *this,string_view pattern,path *basePath,bool isLibraryFile,
          SourceLibrary *library,UnitEntry *unit,bool expandEnvVars)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong hash;
  path *path;
  ulong uVar17;
  ulong uVar18;
  ulong pos0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 results;
  path *ppVar19;
  SourceLoader *pSVar20;
  pointer args_1;
  undefined1 auVar21 [16];
  string_view pattern_00;
  error_code ec_00;
  string_view fmt;
  format_args args;
  error_code *ec_01;
  bool isLibraryFile_local;
  try_emplace_args_t local_169;
  SourceLoader *local_168;
  GlobRank rank;
  table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
  *local_158;
  vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
  *local_150;
  SourceLibrary *library_local;
  locator res;
  pointer local_118;
  size_type sStack_110;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  path *local_e0;
  error_code ec;
  string_view pattern_local;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  
  bVar11 = expandEnvVars;
  pattern_00._M_len = pattern._M_str;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)files.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  ec_01 = (error_code *)0x17addb;
  isLibraryFile_local = isLibraryFile;
  local_168 = this;
  library_local = library;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern_00._M_len;
  ec._M_cat = (error_category *)std::_V2::system_category();
  results._1_7_ = 0;
  results._0_1_ = bVar11;
  pattern_00._M_str = (char *)0x0;
  rank = svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(GlobMode)&files,
                (SmallVector<std::filesystem::__cxx11::path,_2UL> *)results.values_,SUB81(&ec,0),
                ec_01);
  if (ec._M_value == 0) {
    local_150 = (vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
                 *)&local_168->fileEntries;
    path = (path *)(((long)(local_168->fileEntries).
                           super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_168->fileEntries).
                           super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 +
                   files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
    std::
    vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
    ::reserve((vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
               *)local_150,(size_type)path);
    if (files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len != 0) {
      local_e0 = files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
                 files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
      local_158 = (table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
                   *)&local_168->fileIndex;
      local_108 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &local_168->errors;
      pSVar20 = local_168;
      args_1 = files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
      do {
        local_118 = (pointer)(((long)(pSVar20->fileEntries).
                                     super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar20->fileEntries).
                                     super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5);
        uVar15 = std::filesystem::__cxx11::hash_value(args_1);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar15;
        hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar15 = hash >> ((byte)(pSVar20->fileIndex).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                                .arrays.groups_size_index & 0x3f);
        lVar16 = (hash & 0xff) * 4;
        uVar7 = (&UNK_00461acc)[lVar16];
        uVar8 = (&UNK_00461acd)[lVar16];
        uVar9 = (&UNK_00461ace)[lVar16];
        bVar10 = (&UNK_00461acf)[lVar16];
        uVar18 = (ulong)((uint)hash & 7);
        uVar17 = 0;
        pos0 = uVar15;
        do {
          pgVar3 = (pSVar20->fileIndex).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                   .arrays.groups_;
          pgVar1 = pgVar3 + uVar15;
          bVar12 = pgVar1->m[0xf].n;
          auVar21[0] = -(pgVar1->m[0].n == uVar7);
          auVar21[1] = -(pgVar1->m[1].n == uVar8);
          auVar21[2] = -(pgVar1->m[2].n == uVar9);
          auVar21[3] = -(pgVar1->m[3].n == bVar10);
          auVar21[4] = -(pgVar1->m[4].n == uVar7);
          auVar21[5] = -(pgVar1->m[5].n == uVar8);
          auVar21[6] = -(pgVar1->m[6].n == uVar9);
          auVar21[7] = -(pgVar1->m[7].n == bVar10);
          auVar21[8] = -(pgVar1->m[8].n == uVar7);
          auVar21[9] = -(pgVar1->m[9].n == uVar8);
          auVar21[10] = -(pgVar1->m[10].n == uVar9);
          auVar21[0xb] = -(pgVar1->m[0xb].n == bVar10);
          auVar21[0xc] = -(pgVar1->m[0xc].n == uVar7);
          auVar21[0xd] = -(pgVar1->m[0xd].n == uVar8);
          auVar21[0xe] = -(pgVar1->m[0xe].n == uVar9);
          auVar21[0xf] = -(bVar12 == bVar10);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
          if (uVar14 != 0) {
            ppVar4 = (pSVar20->fileIndex).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                     .arrays.elements_;
            local_100 = pos0;
            local_f8 = uVar18;
            local_f0 = uVar17;
            local_e8 = uVar15;
            do {
              iVar13 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
                }
              }
              ppVar19 = (path *)((long)&ppVar4[uVar15 * 0xf].first._M_pathname._M_dataplus._M_p +
                                (ulong)(uint)(iVar13 * 0x30));
              path = ppVar19;
              iVar13 = std::filesystem::__cxx11::path::compare(args_1);
              pSVar20 = local_168;
              if (iVar13 == 0) {
                lVar16 = (long)ppVar19[1]._M_pathname._M_dataplus._M_p * 0x68;
                if (*(long *)(*(long *)local_150 + 0x58 + lVar16) == 0 && unit == (UnitEntry *)0x0)
                {
                  lVar16 = *(long *)local_150 + lVar16;
                  *(byte *)(lVar16 + 100) = *(byte *)(lVar16 + 100) & isLibraryFile_local;
                  if (library_local != (SourceLibrary *)0x0) {
                    if ((*(long *)(lVar16 + 0x48) == 0) ||
                       ((int)rank < (int)*(GlobRank *)(lVar16 + 0x60))) {
                      *(SourceLibrary **)(lVar16 + 0x48) = library_local;
                      *(GlobRank *)(lVar16 + 0x60) = rank;
                      *(undefined8 *)(lVar16 + 0x50) = 0;
                    }
                    else if (rank == *(GlobRank *)(lVar16 + 0x60)) {
                      *(SourceLibrary **)(lVar16 + 0x50) = library_local;
                    }
                  }
                }
                else {
                  local_118 = (args_1->_M_pathname)._M_dataplus._M_p;
                  sStack_110 = (args_1->_M_pathname)._M_string_length;
                  path = (path *)&res;
                  fmt.size_ = 0xd;
                  fmt.data_ = (char *)0x2c;
                  args.field_1.args_ = results.args_;
                  args.desc_ = (unsigned_long_long)&local_118;
                  ::fmt::v11::vformat_abi_cxx11_
                            ((string *)path,(v11 *)"\'{}\': included in multiple compilation units",
                             fmt,args);
                  pSVar20 = local_168;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            (local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             path);
                  if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)&res.p) {
                    path = (path *)((long)&((res.p)->first)._M_pathname._M_dataplus._M_p + 1);
                    operator_delete(res.pg,(size_t)path);
                  }
                }
                goto LAB_0017b17c;
              }
              uVar14 = uVar14 - 1 & uVar14;
            } while (uVar14 != 0);
            bVar12 = pgVar3[uVar15].m[0xf].n;
            uVar15 = local_e8;
            uVar17 = local_f0;
            uVar18 = local_f8;
            pos0 = local_100;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar18] & bVar12) == 0) break;
          uVar5 = (pSVar20->fileIndex).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                  .arrays.groups_size_mask;
          lVar16 = uVar15 + uVar17;
          uVar17 = uVar17 + 1;
          uVar15 = lVar16 + 1U & uVar5;
        } while (uVar17 <= uVar5);
        if ((pSVar20->fileIndex).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
            .size_ctrl.size <
            (pSVar20->fileIndex).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                    (&res,local_158,(arrays_type *)local_158,pos0,hash,&local_169,args_1,
                     (unsigned_long *)&local_118);
          psVar2 = &(pSVar20->fileIndex).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                    .size_ctrl.size;
          *psVar2 = *psVar2 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                    (&res,local_158,hash,&local_169,args_1,(unsigned_long *)&local_118);
        }
        results.values_ = (value<fmt::v11::context> *)&rank;
        path = args_1;
        std::
        vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
        ::
        emplace_back<std::filesystem::__cxx11::path,bool&,slang::SourceLibrary_const*&,slang::driver::SourceLoader::UnitEntry_const*&,slang::GlobRank&>
                  (local_150,args_1,&isLibraryFile_local,&library_local,&unit,
                   (GlobRank *)results.values_);
LAB_0017b17c:
        args_1 = args_1 + 1;
      } while (args_1 != local_e0);
    }
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)&res,&pattern_local,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = ec._M_value;
    path = (path *)&res;
    ec_00._M_cat = ec._M_cat;
    addError(local_168,path,ec_00);
    std::filesystem::__cxx11::path::~path((path *)&res);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&files.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)path);
  return;
}

Assistant:

void SourceLoader::addFilesInternal(std::string_view pattern, const fs::path& basePath,
                                    bool isLibraryFile, const SourceLibrary* library,
                                    const UnitEntry* unit, bool expandEnvVars) {
    SmallVector<fs::path> files;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, GlobMode::Files, files, expandEnvVars, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    fileEntries.reserve(fileEntries.size() + files.size());
    for (auto&& path : files) {
        auto [it, inserted] = fileIndex.try_emplace(path, fileEntries.size());
        if (inserted) {
            fileEntries.emplace_back(std::move(path), isLibraryFile, library, unit, rank);
        }
        else {
            // If this file is supposed to be in a separate unit but is already
            // included elsewhere we should error.
            auto& entry = fileEntries[it->second];
            if (unit || entry.unit) {
                errors.emplace_back(
                    fmt::format("'{}': included in multiple compilation units", getU8Str(path)));
                continue;
            }

            // If any of the times we see this is entry is for a non-library file,
            // then it's always a non-library file, hence the &=.
            entry.isLibraryFile &= isLibraryFile;

            if (library) {
                // If there is already a library for this entry and our rank is lower,
                // we overrule it. If it's higher, we ignore. If it's a tie, we remember
                // that fact for now and later we will issue an error if the tie is
                // never resolved.
                if (!entry.library || rank < entry.libraryRank) {
                    entry.library = library;
                    entry.libraryRank = rank;
                    entry.secondLib = nullptr;
                }
                else if (rank == entry.libraryRank) {
                    entry.secondLib = library;
                }
            }
        }
    }
}